

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_vexp.c
# Opt level: O0

ex_ex * eval_sigidx(expr *expr,ex_ex *eptr,ex_ex *optr,int idx)

{
  int iVar1;
  ex_ex *peVar2;
  float local_5c;
  float local_58;
  t_float rem_i;
  t_float fi;
  int i;
  ex_ex *reteptr;
  ex_ex arg;
  int idx_local;
  ex_ex *optr_local;
  ex_ex *eptr_local;
  expr *expr_local;
  
  arg.ex_end._4_4_ = idx;
  memset(&reteptr,0,0x18);
  rem_i = 0.0;
  local_58 = 0.0;
  arg.ex_cont.v_int = 0;
  reteptr = (ex_ex *)0x0;
  peVar2 = ex_eval(expr,eptr + 1,(ex_ex *)&reteptr,arg.ex_end._4_4_);
  if (arg.ex_cont.v_int == 2) {
    local_58 = reteptr._0_4_;
    rem_i = (t_float)(int)reteptr._0_4_;
    local_5c = reteptr._0_4_ - (float)(int)rem_i;
  }
  else {
    if (arg.ex_cont.v_int == 1) {
      local_58 = (float)(long)reteptr;
      rem_i = reteptr._0_4_;
    }
    else {
      post("eval_sigidx: bad res type (%d)",arg.ex_cont.v_int);
    }
    local_5c = 0.0;
  }
  optr->ex_type = 2;
  if (eptr->ex_type == 0x12) {
    if (0.0 < local_58) {
      if ((expr->exp_error & 4U) == 0) {
        expr->exp_error = expr->exp_error | 4;
        post("expr: input vector index > 0, (vector x%d[%f])",(double)((float)(int)rem_i + local_5c)
             ,(eptr->ex_cont).v_int + 1);
        post("fexpr~: index assumed to be = 0");
        post("fexpr~: no error report till next reset");
        ex_print(eptr);
      }
      rem_i = 0.0;
      local_5c = 0.0;
    }
    iVar1 = cal_sigidx(optr,(int)rem_i,local_5c,arg.ex_end._4_4_,expr->exp_vsize,
                       expr->exp_var[(eptr->ex_cont).v_int].ex_cont.v_vec,
                       expr->exp_p_var[(eptr->ex_cont).v_int]);
    if ((iVar1 != 0) && ((expr->exp_error & 4U) == 0)) {
      expr->exp_error = expr->exp_error | 4;
      post("expr: input vector index <  -VectorSize, (vector x%d[%f])",(double)local_58,
           (eptr->ex_cont).v_int + 1);
      ex_print(eptr);
      post("fexpr~: index assumed to be = -%d",(ulong)(uint)expr->exp_vsize);
      post("fexpr~: no error report till next reset");
    }
  }
  else if (eptr->ex_type == 0x10) {
    if (0.0 <= local_58) {
      if ((expr->exp_error & 2U) == 0) {
        expr->exp_error = expr->exp_error | 2;
        post("fexpr~: bad output index, (%f)",(double)local_58);
        ex_print(eptr);
        post("fexpr~: no error report till next reset");
        post("fexpr~: index assumed to be = -1");
      }
      rem_i = -NAN;
    }
    if ((eptr->ex_cont).v_int < (long)expr->exp_nexpr) {
      iVar1 = cal_sigidx(optr,(int)rem_i,local_5c,arg.ex_end._4_4_,expr->exp_vsize,
                         expr->exp_tmpres[(eptr->ex_cont).v_int],
                         expr->exp_p_res[(eptr->ex_cont).v_int]);
      if ((iVar1 != 0) && ((expr->exp_error & 2U) == 0)) {
        expr->exp_error = expr->exp_error | 2;
        post("fexpr~: bad output index, (%f)",(double)local_58);
        ex_print(eptr);
        post("fexpr~: index assumed to be = -%d",(ulong)(uint)expr->exp_vsize);
      }
    }
    else {
      post("fexpr~: $y%d illegal: not that many exprs",(eptr->ex_cont).v_int);
      (optr->ex_cont).v_flt = 0.0;
    }
  }
  else {
    (optr->ex_cont).v_flt = 0.0;
    post("fexpr~:eval_sigidx: internal error - unknown vector (%d)",eptr->ex_type);
  }
  return peVar2;
}

Assistant:

struct ex_ex *
eval_sigidx(struct expr *expr, struct ex_ex *eptr, struct ex_ex *optr, int idx)
/* the expr object data pointer */
/* the operation stack */
/* the result pointer */
/* the index */
{
        struct ex_ex arg = { 0 };
        struct ex_ex *reteptr;
        int i = 0;
        t_float fi = 0,         /* index in float */
              rem_i = 0;        /* remains of the float */

        arg.ex_type = 0;
        arg.ex_int = 0;
        reteptr = ex_eval(expr, eptr + 1, &arg, idx);
        if (arg.ex_type == ET_FLT) {
                fi = arg.ex_flt;                /* float index */
                i = (int) arg.ex_flt;           /* integer index */
                rem_i =  arg.ex_flt - i;        /* remains of integer */
        } else if (arg.ex_type == ET_INT) {
                fi = arg.ex_int;                /* float index */
                i = (int) arg.ex_int;           /* integer index */
                rem_i = 0;
        } else {
                post("eval_sigidx: bad res type (%d)", arg.ex_type);
        }
        optr->ex_type = ET_FLT;
        /*
         * indexing an input vector
         */
        if (eptr->ex_type == ET_XI) {
                if (fi > 0) {
                        if (!(expr->exp_error & EE_BI_INPUT)) {
                                expr->exp_error |= EE_BI_INPUT;
                          post("expr: input vector index > 0, (vector x%d[%f])",
                                               eptr->ex_int + 1, i + rem_i);
                                post("fexpr~: index assumed to be = 0");
                                post("fexpr~: no error report till next reset");
                                ex_print(eptr);
                        }
                        /* just replace it with zero */
                        i = 0;
                        rem_i = 0;
                }
                if (cal_sigidx(optr, i, rem_i, idx, expr->exp_vsize,
                                        expr->exp_var[eptr->ex_int].ex_vec,
                                                expr->exp_p_var[eptr->ex_int])) {
                        if (!(expr->exp_error & EE_BI_INPUT)) {
                                expr->exp_error |= EE_BI_INPUT;
                                post("expr: input vector index <  -VectorSize, (vector x%d[%f])", eptr->ex_int + 1, fi);
                                ex_print(eptr);
                                post("fexpr~: index assumed to be = -%d",
                                        expr->exp_vsize);
                                post("fexpr~: no error report till next reset");
                        }
                }

        /*
         * indexing an output vector
         */
        } else if (eptr->ex_type == ET_YO) {
                /* for output vectors index of zero is not legal */
                if (fi >= 0) {
                        if (!(expr->exp_error & EE_BI_OUTPUT)) {
                                expr->exp_error |= EE_BI_OUTPUT;
                                post("fexpr~: bad output index, (%f)", fi);
                                ex_print(eptr);
                                post("fexpr~: no error report till next reset");
                                post("fexpr~: index assumed to be = -1");
                        }
                        i = -1;
                }
                if (eptr->ex_int >= expr->exp_nexpr) {
                        post("fexpr~: $y%d illegal: not that many exprs",
                                                                eptr->ex_int);
                        optr->ex_flt = 0;
                        return (reteptr);
                }
                if (cal_sigidx(optr, i, rem_i, idx, expr->exp_vsize,
                             expr->exp_tmpres[eptr->ex_int],
                                                expr->exp_p_res[eptr->ex_int])) {
                        if (!(expr->exp_error & EE_BI_OUTPUT)) {
                                expr->exp_error |= EE_BI_OUTPUT;
                                post("fexpr~: bad output index, (%f)", fi);
                                ex_print(eptr);
                                post("fexpr~: index assumed to be = -%d",
                                        expr->exp_vsize);
                        }
                }
        } else {
                optr->ex_flt = 0;
                post("fexpr~:eval_sigidx: internal error - unknown vector (%d)",
                                                                eptr->ex_type);
        }
        return (reteptr);
}